

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::msgpack::basic_msgpack_cursor<jsoncons::bytes_source,std::allocator<char>>::
reset<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
          (basic_msgpack_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source)

{
  ulong uVar1;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  basic_staj_visitor<char> *in_stack_00000030;
  
  basic_msgpack_parser<jsoncons::bytes_source,std::allocator<char>>::
  reset<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            ((basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_> *)this,source);
  basic_staj_visitor<char>::reset(in_stack_00000030);
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::reset(in_RSI);
  *(undefined1 *)(in_RDI + 0x3a) = 0;
  uVar1 = (**(code **)(*in_RDI + 0x18))();
  if ((uVar1 & 1) == 0) {
    (**(code **)(*in_RDI + 0x38))();
  }
  return;
}

Assistant:

void reset(Sourceable&& source)
    {
        parser_.reset(std::forward<Sourceable>(source));
        cursor_visitor_.reset();
        cursor_handler_adaptor_.reset();
        eof_ = false;
        if (!done())
        {
            next();
        }
    }